

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datumtest.cpp
# Opt level: O3

int testDatumPushPopString(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  VRString f;
  VRString g;
  VRString h;
  VRDatumString a;
  long *local_138;
  long local_130;
  long local_128 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  VRString local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
  local_98;
  
  iVar3 = 0;
  iVar4 = 10;
  do {
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"hello","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_138,local_130 + (long)local_138);
    MinVR::VRDatumString::VRDatumString((VRDatumString *)&local_98,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_98.needPush = true;
    local_98.stackFrame = local_98.stackFrame + 1;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"good-bye","");
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::setValue(&local_98,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    (*local_98.super_VRDatum._vptr_VRDatum[2])(local_d8,&local_98);
    iVar1 = std::__cxx11::string::compare((char *)local_d8);
    MinVR::
    VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
    ::pop(&local_98);
    (*local_98.super_VRDatum._vptr_VRDatum[2])(local_b8,&local_98);
    iVar2 = std::__cxx11::string::compare((char *)local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0],local_c8[0] + 1);
    }
    local_98.super_VRDatum._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_0014a550;
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_98.value.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    MinVR::VRDatum::~VRDatum(&local_98.super_VRDatum);
    if (local_138 != local_128) {
      operator_delete(local_138,local_128[0] + 1);
    }
    iVar3 = iVar3 + iVar1 + iVar2;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return iVar3;
}

Assistant:

int testDatumPushPopString() {

  int out = 0;

  LOOP {

    MinVR::VRString f = "hello";
    MinVR::VRDatumString a = MinVR::VRDatumString(f);

    a.push();
    a.setValue("good-bye");
    MinVR::VRString g = a.getValue();
    out += g.compare("good-bye");

    a.pop();
    MinVR::VRString h = a.getValue();
    out += h.compare("hello");
  }